

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::hex_writer>>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
           *this,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::int_writer<long_long,_fmt::v5::basic_format_specs<char>_>::hex_writer>
          *f)

{
  undefined4 uVar1;
  unsigned_long __n;
  __type _Var3;
  counting_iterator<char> __first;
  counting_iterator<char> __first_00;
  counting_iterator<char> __first_01;
  char_type fill;
  char local_29;
  undefined8 uVar2;
  
  __n = (ulong)spec->width_ - f->size_;
  if ((ulong)spec->width_ < f->size_ || __n == 0) {
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::hex_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::hex_writer>
                  *)f,(counting_iterator<char> *)this);
    return;
  }
  local_29 = (char)spec->fill_;
  if (spec->align_ == ALIGN_CENTER) {
    __first_00._12_4_ = 0;
    __first_00._0_12_ = *(undefined1 (*) [12])this;
    _Var3 = std::__fill_n_a1<fmt::v5::internal::counting_iterator<char>,unsigned_long,char>
                      (__first_00,__n >> 1,&local_29);
    *(size_t *)this = _Var3.count_;
    this[8] = (basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>)
              _Var3.blackhole_;
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::hex_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::hex_writer>
                  *)f,(counting_iterator<char> *)this);
    uVar2 = *(undefined8 *)this;
    __n = __n - (__n >> 1);
    uVar1 = *(undefined4 *)(this + 8);
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      __first._12_4_ = 0;
      __first._0_12_ = *(undefined1 (*) [12])this;
      _Var3 = std::__fill_n_a1<fmt::v5::internal::counting_iterator<char>,unsigned_long,char>
                        (__first,__n,&local_29);
      *(size_t *)this = _Var3.count_;
      this[8] = (basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
                 )_Var3.blackhole_;
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::hex_writer>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::hex_writer>
                    *)f,(counting_iterator<char> *)this);
      return;
    }
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::hex_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::hex_writer>
                  *)f,(counting_iterator<char> *)this);
    uVar2 = *(undefined8 *)this;
    uVar1 = *(undefined4 *)(this + 8);
  }
  __first_01._8_4_ = uVar1;
  __first_01.count_ = uVar2;
  __first_01._12_4_ = 0;
  _Var3 = std::__fill_n_a1<fmt::v5::internal::counting_iterator<char>,unsigned_long,char>
                    (__first_01,__n,&local_29);
  *(size_t *)this = _Var3.count_;
  this[8] = (basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>)
            _Var3.blackhole_;
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }